

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles2::Functional::anon_unknown_0::requireShaderCompiler
               (TestContext *testCtx,CallLogWrapper *gl)

{
  NotSupportedError *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  StateQueryMemoryWriteGuard<unsigned_char> local_43;
  string local_40;
  
  local_43.m_preguard = 0xde;
  local_43.m_value = 0xde;
  local_43.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv(gl,0x8dfa,&local_43.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_43,testCtx);
  if ((bVar1) && (local_43.m_value == '\x01')) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Test requires SHADER_COMPILER = TRUE","");
  tcu::NotSupportedError::NotSupportedError(this,&local_40);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void requireShaderCompiler (tcu::TestContext& testCtx, glu::CallLogWrapper& gl)
{
	StateQueryMemoryWriteGuard<GLboolean> state;
	gl.glGetBooleanv(GL_SHADER_COMPILER, &state);

	if (!state.verifyValidity(testCtx) || state != GL_TRUE)
		throw tcu::NotSupportedError("Test requires SHADER_COMPILER = TRUE");
}